

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iteratedhash.hpp
# Opt level: O1

void __thiscall
crypto::iterated_hash<crypto::sha1_transform>::pad
          (iterated_hash<crypto::sha1_transform> *this,size_t last_block_size,char pad_first)

{
  long lVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  ulong uVar28;
  char *pcVar29;
  long lVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  hash_word aligned_buffer [16];
  undefined4 local_58;
  char acStack_54 [60];
  
  uVar28 = (ulong)(this->count_lo & 0x3f);
  pcVar29 = this->buffer + uVar28;
  *pcVar29 = pad_first;
  if (uVar28 < last_block_size) {
    memset(pcVar29 + 1,0,last_block_size - (uVar28 + 1));
    return;
  }
  lVar30 = 0;
  memset(pcVar29 + 1,0,uVar28 ^ 0x3f);
  do {
    auVar31 = *(undefined1 (*) [16])(this->buffer + lVar30 * 4);
    auVar32[1] = 0;
    auVar32[0] = auVar31[8];
    auVar32[2] = auVar31[9];
    auVar32[3] = 0;
    auVar32[4] = auVar31[10];
    auVar32[5] = 0;
    auVar32[6] = auVar31[0xb];
    auVar32[7] = 0;
    auVar32[8] = auVar31[0xc];
    auVar32[9] = 0;
    auVar32[10] = auVar31[0xd];
    auVar32[0xb] = 0;
    auVar32[0xc] = auVar31[0xe];
    auVar32[0xd] = 0;
    auVar32[0xe] = auVar31[0xf];
    auVar32[0xf] = 0;
    auVar32 = pshuflw(auVar32,auVar32,0x1b);
    auVar32 = pshufhw(auVar32,auVar32,0x1b);
    auVar18[0xd] = 0;
    auVar18._0_13_ = auVar31._0_13_;
    auVar18[0xe] = auVar31[7];
    auVar19[0xc] = auVar31[6];
    auVar19._0_12_ = auVar31._0_12_;
    auVar19._13_2_ = auVar18._13_2_;
    auVar20[0xb] = 0;
    auVar20._0_11_ = auVar31._0_11_;
    auVar20._12_3_ = auVar19._12_3_;
    auVar21[10] = auVar31[5];
    auVar21._0_10_ = auVar31._0_10_;
    auVar21._11_4_ = auVar20._11_4_;
    auVar22[9] = 0;
    auVar22._0_9_ = auVar31._0_9_;
    auVar22._10_5_ = auVar21._10_5_;
    auVar23[8] = auVar31[4];
    auVar23._0_8_ = auVar31._0_8_;
    auVar23._9_6_ = auVar22._9_6_;
    auVar25._7_8_ = 0;
    auVar25._0_7_ = auVar23._8_7_;
    auVar26._1_8_ = SUB158(auVar25 << 0x40,7);
    auVar26[0] = auVar31[3];
    auVar26._9_6_ = 0;
    auVar27._1_10_ = SUB1510(auVar26 << 0x30,5);
    auVar27[0] = auVar31[2];
    auVar27._11_4_ = 0;
    auVar24[2] = auVar31[1];
    auVar24._0_2_ = auVar31._0_2_;
    auVar24._3_12_ = SUB1512(auVar27 << 0x20,3);
    auVar31._0_2_ = auVar31._0_2_ & 0xff;
    auVar31._2_13_ = auVar24._2_13_;
    auVar31[0xf] = 0;
    auVar31 = pshuflw(auVar31,auVar31,0x1b);
    auVar31 = pshufhw(auVar31,auVar31,0x1b);
    sVar2 = auVar31._0_2_;
    sVar3 = auVar31._2_2_;
    sVar4 = auVar31._4_2_;
    sVar5 = auVar31._6_2_;
    sVar6 = auVar31._8_2_;
    sVar7 = auVar31._10_2_;
    sVar8 = auVar31._12_2_;
    sVar9 = auVar31._14_2_;
    sVar10 = auVar32._0_2_;
    sVar11 = auVar32._2_2_;
    sVar12 = auVar32._4_2_;
    sVar13 = auVar32._6_2_;
    sVar14 = auVar32._8_2_;
    sVar15 = auVar32._10_2_;
    sVar16 = auVar32._12_2_;
    sVar17 = auVar32._14_2_;
    lVar1 = lVar30 * 4;
    *(char *)(&local_58 + lVar30) = (0 < sVar2) * (sVar2 < 0x100) * auVar31[0] - (0xff < sVar2);
    *(char *)((long)&local_58 + lVar1 + 1) =
         (0 < sVar3) * (sVar3 < 0x100) * auVar31[2] - (0xff < sVar3);
    *(char *)((long)&local_58 + lVar1 + 2) =
         (0 < sVar4) * (sVar4 < 0x100) * auVar31[4] - (0xff < sVar4);
    *(char *)((long)&local_58 + lVar1 + 3) =
         (0 < sVar5) * (sVar5 < 0x100) * auVar31[6] - (0xff < sVar5);
    acStack_54[lVar1] = (0 < sVar6) * (sVar6 < 0x100) * auVar31[8] - (0xff < sVar6);
    acStack_54[lVar1 + 1] = (0 < sVar7) * (sVar7 < 0x100) * auVar31[10] - (0xff < sVar7);
    acStack_54[lVar1 + 2] = (0 < sVar8) * (sVar8 < 0x100) * auVar31[0xc] - (0xff < sVar8);
    acStack_54[lVar1 + 3] = (0 < sVar9) * (sVar9 < 0x100) * auVar31[0xe] - (0xff < sVar9);
    acStack_54[lVar1 + 4] = (0 < sVar10) * (sVar10 < 0x100) * auVar32[0] - (0xff < sVar10);
    acStack_54[lVar1 + 5] = (0 < sVar11) * (sVar11 < 0x100) * auVar32[2] - (0xff < sVar11);
    acStack_54[lVar1 + 6] = (0 < sVar12) * (sVar12 < 0x100) * auVar32[4] - (0xff < sVar12);
    acStack_54[lVar1 + 7] = (0 < sVar13) * (sVar13 < 0x100) * auVar32[6] - (0xff < sVar13);
    acStack_54[lVar1 + 8] = (0 < sVar14) * (sVar14 < 0x100) * auVar32[8] - (0xff < sVar14);
    acStack_54[lVar1 + 9] = (0 < sVar15) * (sVar15 < 0x100) * auVar32[10] - (0xff < sVar15);
    acStack_54[lVar1 + 10] = (0 < sVar16) * (sVar16 < 0x100) * auVar32[0xc] - (0xff < sVar16);
    acStack_54[lVar1 + 0xb] = (0 < sVar17) * (sVar17 < 0x100) * auVar32[0xe] - (0xff < sVar17);
    lVar30 = lVar30 + 4;
  } while (lVar30 != 0x10);
  sha1_transform::transform(this->state,&local_58);
  memset(this,0,last_block_size);
  return;
}

Assistant:

void iterated_hash<T>::pad(size_t last_block_size, char pad_first) {
	
	size_t num = util::mod_power_of_2(count_lo, size_t(block_size));
	
	buffer[num++] = pad_first;
	
	if(num <= last_block_size) {
		memset(buffer + num, 0, last_block_size - num);
	} else {
		memset(buffer + num, 0, block_size - num);
		hash(state, buffer, block_size);
		memset(buffer, 0, last_block_size);
	}
}